

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_lscbx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 EA;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  uintptr_t o_2;
  uintptr_t o;
  TCGTemp *ret;
  uintptr_t o_1;
  uintptr_t o_3;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  EA = tcg_temp_new_i64(tcg_ctx);
  pTVar1 = tcg_const_i32_ppc64(tcg_ctx,ctx->opcode >> 0x15 & 0x1f);
  pTVar2 = tcg_const_i32_ppc64(tcg_ctx,*(ushort *)((long)&ctx->opcode + 2) & 0x1f);
  pTVar3 = tcg_const_i32_ppc64(tcg_ctx,ctx->opcode >> 0xb & 0x1f);
  gen_addr_reg_index(ctx,EA);
  local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  ret = (TCGTemp *)(EA + (long)tcg_ctx);
  local_50 = ret;
  local_48 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  local_40 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
  local_38 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
  tcg_gen_callN_ppc64(tcg_ctx,helper_lscbx_ppc64,ret,5,&local_58);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  tcg_gen_andi_i64_ppc64(tcg_ctx,cpu_xer,cpu_xer,-0x80);
  tcg_gen_or_i64_ppc64(tcg_ctx,cpu_xer,cpu_xer,EA);
  if ((ctx->opcode & 1) != 0) {
    gen_set_Rc0(ctx,EA);
  }
  tcg_temp_free_internal_ppc64(tcg_ctx,ret);
  return;
}

Assistant:

static void gen_lscbx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv_i32 t1 = tcg_const_i32(tcg_ctx, rD(ctx->opcode));
    TCGv_i32 t2 = tcg_const_i32(tcg_ctx, rA(ctx->opcode));
    TCGv_i32 t3 = tcg_const_i32(tcg_ctx, rB(ctx->opcode));

    gen_addr_reg_index(ctx, t0);
    gen_helper_lscbx(tcg_ctx, t0, tcg_ctx->cpu_env, t0, t1, t2, t3);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
    tcg_temp_free_i32(tcg_ctx, t3);
    tcg_gen_andi_tl(tcg_ctx, cpu_xer, cpu_xer, ~0x7F);
    tcg_gen_or_tl(tcg_ctx, cpu_xer, cpu_xer, t0);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t0);
    }
    tcg_temp_free(tcg_ctx, t0);
}